

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool __thiscall
llvm::sys::path::reverse_iterator::operator==(reverse_iterator *this,reverse_iterator *RHS)

{
  iterator pcVar1;
  iterator pcVar2;
  bool bVar3;
  bool local_a1;
  reverse_iterator *RHS_local;
  reverse_iterator *this_local;
  char *local_50;
  size_t local_48;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  pcVar1 = StringRef::begin(&this->Path);
  pcVar2 = StringRef::begin(&RHS->Path);
  local_a1 = false;
  if (pcVar1 == pcVar2) {
    local_50 = (this->Component).Data;
    local_48 = (this->Component).Length;
    local_38 = (RHS->Component).Data;
    local_30 = (RHS->Component).Length;
    local_40 = &local_50;
    bVar3 = false;
    if (local_48 == local_30) {
      if (local_30 == 0) {
        local_c = 0;
      }
      else {
        local_28 = local_30;
        local_20 = local_38;
        local_18 = local_50;
        local_c = memcmp(local_50,local_38,local_30);
      }
      bVar3 = local_c == 0;
    }
    local_a1 = false;
    if (bVar3) {
      local_a1 = this->Position == RHS->Position;
    }
  }
  return local_a1;
}

Assistant:

bool reverse_iterator::operator==(const reverse_iterator &RHS) const {
  return Path.begin() == RHS.Path.begin() && Component == RHS.Component &&
         Position == RHS.Position;
}